

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

int * Wlc_VecCopy(Vec_Int_t *vOut,int *pArray,int nSize)

{
  int *piVar1;
  int local_20;
  int i;
  int nSize_local;
  int *pArray_local;
  Vec_Int_t *vOut_local;
  
  Vec_IntClear(vOut);
  for (local_20 = 0; local_20 < nSize; local_20 = local_20 + 1) {
    Vec_IntPush(vOut,pArray[local_20]);
  }
  piVar1 = Vec_IntArray(vOut);
  return piVar1;
}

Assistant:

int * Wlc_VecCopy( Vec_Int_t * vOut, int * pArray, int nSize )
{
    int i; Vec_IntClear( vOut );
    for( i = 0; i < nSize; i++) 
        Vec_IntPush( vOut, pArray[i] );
    return Vec_IntArray( vOut );
}